

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::FunctionBody::CanInlineRecursively(FunctionBody *this,uint depth,bool tryAggressive)

{
  DynamicProfileInfo *pDVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32 uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  
  uVar8 = DAT_015b8edc;
  uVar4 = DAT_015b8ed8;
  uVar3 = DAT_015b8ed4;
  pDVar1 = (this->dynamicProfileInfo).ptr;
  uVar9 = 0;
  uVar5 = 0;
  if (pDVar1 != (DynamicProfileInfo *)0x0) {
    uVar5 = pDVar1->m_recursiveInlineInfo;
  }
  if (uVar5 != 0) {
    uVar9 = 0;
    uVar7 = (ulong)uVar5;
    do {
      uVar9 = uVar9 + (uVar5 & 1);
      uVar7 = uVar7 >> 1;
      bVar2 = 1 < uVar5;
      uVar5 = (uint)uVar7;
    } while (bVar2);
  }
  if (tryAggressive && uVar9 == this->profiledCallSiteCount) {
    uVar6 = GetCountField(this,ByteCodeWithoutLDACount);
    uVar5 = (uint)((ulong)uVar3 / (ulong)uVar6);
    if (uVar9 != 1) {
      dVar10 = log((double)(int)uVar9);
      auVar11._0_8_ = log((double)((ulong)uVar3 / (ulong)uVar6) / dVar10);
      auVar11._8_8_ = extraout_XMM0_Qb;
      auVar11 = roundsd(auVar11,auVar11,10);
      uVar5 = (uint)(long)auVar11._0_8_;
    }
    if (uVar8 < uVar5) {
      uVar8 = uVar5;
    }
    if (uVar4 <= uVar8) {
      uVar8 = uVar4;
    }
  }
  return depth < uVar8;
}

Assistant:

bool FunctionBody::CanInlineRecursively(uint depth, bool tryAggressive)
    {
        uint recursiveInlineSpan = this->GetNumberOfRecursiveCallSites();

        uint minRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMin);

        if (recursiveInlineSpan != this->GetProfiledCallSiteCount() || tryAggressive == false)
        {
            return depth < minRecursiveInlineDepth;
        }

        uint maxRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMax);
        uint maxRecursiveBytecodeBudget = (uint)CONFIG_FLAG(RecursiveInlineThreshold);
        uint numberOfAllowedFuncs = maxRecursiveBytecodeBudget / this->GetByteCodeWithoutLDACount();
        uint maxDepth;

        if (recursiveInlineSpan == 1)
        {
            maxDepth = numberOfAllowedFuncs;
        }
        else
        {
            maxDepth = (uint)ceil(log((double)((double)numberOfAllowedFuncs) / log((double)recursiveInlineSpan)));
        }
        maxDepth = maxDepth < minRecursiveInlineDepth ? minRecursiveInlineDepth : maxDepth;
        maxDepth = maxDepth < maxRecursiveInlineDepth ? maxDepth : maxRecursiveInlineDepth;
        return depth < maxDepth;
    }